

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O0

void outputString(char *s,char *outBuf,int32_t *outIx,int32_t capacity,int32_t indent)

{
  char c_00;
  int local_2c;
  char c;
  int32_t i;
  int32_t indent_local;
  int32_t capacity_local;
  int32_t *outIx_local;
  char *outBuf_local;
  char *s_local;
  
  local_2c = 0;
  outBuf_local = s;
  if (s == (char *)0x0) {
    outBuf_local = "*NULL*";
  }
  do {
    c_00 = outBuf_local[local_2c];
    outputChar(c_00,outBuf,outIx,capacity,indent);
    local_2c = local_2c + 1;
  } while (c_00 != '\0');
  return;
}

Assistant:

static void outputString(const char *s, char *outBuf, int32_t *outIx, int32_t capacity, int32_t indent) {
    int32_t i = 0;
    char    c;
    if (s==NULL) {
        s = "*NULL*";
    }
    do {
        c = s[i++];
        outputChar(c, outBuf, outIx, capacity, indent);
    } while (c != 0);
}